

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetFieldWithLocalizedDigits
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,uint8_t minDigits,
          uint8_t maxDigits,uint16_t minVal,uint16_t maxVal,int32_t *parsedLen)

{
  short sVar1;
  int32_t iVar2;
  int iVar3;
  undefined7 in_register_00000009;
  int iVar4;
  undefined3 in_register_00000081;
  undefined2 in_register_0000008a;
  uint uVar5;
  int32_t digitLen;
  int32_t local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_3c = CONCAT22(in_register_0000008a,minVal);
  local_34 = CONCAT31(in_register_00000081,maxDigits);
  local_38 = (uint)CONCAT71(in_register_00000009,minDigits);
  *parsedLen = 0;
  digitLen = 0;
  uVar5 = 0;
  iVar4 = 0;
  local_40 = start;
  while( true ) {
    sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (text->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if ((iVar3 <= start) || (local_34 <= uVar5)) break;
    iVar2 = parseSingleLocalizedDigit(this,text,start,&digitLen);
    if ((iVar2 < 0) || (iVar3 = iVar2 + iVar4 * 10, (int)(uint)maxVal < iVar3)) break;
    uVar5 = uVar5 + 1;
    start = start + digitLen;
    iVar4 = iVar3;
  }
  iVar2 = -1;
  if (((local_38 & 0xff) <= uVar5) && ((int)(local_3c & 0xffff) <= iVar4)) {
    *parsedLen = start - local_40;
    iVar2 = iVar4;
  }
  return iVar2;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetFieldWithLocalizedDigits(const UnicodeString& text, int32_t start, uint8_t minDigits, uint8_t maxDigits, uint16_t minVal, uint16_t maxVal, int32_t& parsedLen) const {
    parsedLen = 0;

    int32_t decVal = 0;
    int32_t numDigits = 0;
    int32_t idx = start;
    int32_t digitLen = 0;

    while (idx < text.length() && numDigits < maxDigits) {
        int32_t digit = parseSingleLocalizedDigit(text, idx, digitLen);
        if (digit < 0) {
            break;
        }
        int32_t tmpVal = decVal * 10 + digit;
        if (tmpVal > maxVal) {
            break;
        }
        decVal = tmpVal;
        numDigits++;
        idx += digitLen;
    }

    // Note: maxVal is checked in the while loop
    if (numDigits < minDigits || decVal < minVal) {
        decVal = -1;
        numDigits = 0;
    } else {
        parsedLen = idx - start;
    }

    return decVal;
}